

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O3

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product
          (vloc_synchronized_edges_iterator_t *this)

{
  pointer peVar1;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar2;
  pointer psVar3;
  loc_edges_maps_t *this_00;
  bool bVar4;
  synchronization_t *psVar5;
  synchronization_t *psVar6;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __end2;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __begin2_1;
  pointer psVar7;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __begin2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  edges;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  local_40;
  
  (this->_cartesian_it)._nranges = 0;
  peVar1 = (this->_cartesian_it)._begins.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._begins.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    (this->_cartesian_it)._begins.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
  }
  peVar1 = (this->_cartesian_it)._ends.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._ends.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    (this->_cartesian_it)._ends.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
  }
  peVar1 = (this->_cartesian_it)._its.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._its.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    (this->_cartesian_it)._its.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
  }
  psVar5 = (this->_sync_it)._M_current;
  psVar6 = (this->_sync_end)._M_current;
  if (psVar5 == psVar6) {
    return;
  }
LAB_001d799c:
  pmVar2 = (this->_vloc)._t;
  if (pmVar2 != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
    psVar7 = (psVar5->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (psVar5->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 != psVar3) {
      this_00 = (this->_loc_edges_maps).
                super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      do {
        if (psVar7->_strength == SYNC_STRONG) {
          if ((pmVar2->super_vloc_t).super_loc_array_t.super_vloc_base_t.
              super_array_capacity_t<unsigned_int>._capacity <= psVar7->_pid) goto LAB_001d7a80;
          bVar4 = tchecker::system::loc_edges_maps_t::event
                            (this_00,(loc_id_t)
                                     (&(pmVar2->super_vloc_t).super_loc_array_t._fam)[psVar7->_pid],
                             psVar7->_event_id);
          if (!bVar4) goto LAB_001d79ee;
        }
        psVar7 = psVar7 + 1;
        if (psVar7 == psVar3) {
          psVar5 = (this->_sync_it)._M_current;
          psVar6 = (this->_sync_end)._M_current;
          break;
        }
      } while( true );
    }
    if (psVar5 == psVar6) {
      return;
    }
    psVar7 = (psVar5->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (psVar5->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 == psVar3) {
      return;
    }
    while (pmVar2 = (this->_vloc)._t,
          pmVar2 != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
      if ((pmVar2->super_vloc_t).super_loc_array_t.super_vloc_base_t.
          super_array_capacity_t<unsigned_int>._capacity <= psVar7->_pid) {
LAB_001d7a80:
        __assert_fail("i < BASE::_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                      ,0xfd,
                      "const T &tchecker::make_array_t<unsigned int, 4, tchecker::vloc_base_t>::operator[](typename BASE::capacity_t) const [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vloc_base_t]"
                     );
      }
      local_40 = tchecker::system::loc_edges_maps_t::edges
                           ((this->_loc_edges_maps).
                            super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(loc_id_t)
                                    (&(pmVar2->super_vloc_t).super_loc_array_t._fam)[psVar7->_pid],
                            psVar7->_event_id);
      if ((psVar7->_strength != SYNC_WEAK) ||
         ((shared_ptr<tchecker::system::edge_t> *)local_40._begin.super_const_iterator._M_current !=
          local_40._end.super_const_iterator._M_current.super_const_iterator)) {
        cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
        ::push_back(&this->_cartesian_it,&local_40);
      }
      psVar7 = psVar7 + 1;
      if (psVar7 == psVar3) {
        return;
      }
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::vloc_t>]"
               );
LAB_001d79ee:
  psVar6 = (this->_sync_end)._M_current;
  psVar5 = (this->_sync_it)._M_current + 1;
  (this->_sync_it)._M_current = psVar5;
  if (psVar5 == psVar6) {
    return;
  }
  goto LAB_001d799c;
}

Assistant:

void tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product()
{
  _cartesian_it.clear();

  while (!at_end()) {
    if (tchecker::syncprod::enabled(*_sync_it, *_vloc, *_loc_edges_maps))
      break;
    ++_sync_it;
  }

  if (at_end())
    return;

  auto constraints = _sync_it->synchronization_constraints();
  for (auto const & constr : constraints) {
    auto edges = _loc_edges_maps->edges((*_vloc)[constr.pid()], constr.event_id());
    if ((constr.strength() == tchecker::SYNC_WEAK) && (edges.begin() == edges.end()))
      continue;
    _cartesian_it.push_back(edges);
  }
}